

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

curl_hash_element * Curl_hash_next_element(curl_hash_iterator *iter)

{
  int iVar1;
  int iVar2;
  long lVar3;
  curl_llist_element *pcVar4;
  
  if (iter->current_element != (curl_llist_element *)0x0) {
    pcVar4 = iter->current_element->next;
    iter->current_element = pcVar4;
    if (pcVar4 != (curl_llist_element *)0x0) {
LAB_00497cec:
      return (curl_hash_element *)pcVar4->ptr;
    }
  }
  iVar1 = iter->slot_index;
  iVar2 = iter->hash->slots;
  if (iVar1 < iVar2) {
    lVar3 = 0;
    do {
      pcVar4 = iter->hash->table[iVar1 + lVar3]->head;
      if (pcVar4 != (curl_llist_element *)0x0) {
        iter->current_element = pcVar4;
        iter->slot_index = iVar1 + (int)lVar3 + 1;
        goto LAB_00497cec;
      }
      lVar3 = lVar3 + 1;
    } while ((long)iVar2 - (long)iVar1 != lVar3);
  }
  iter->current_element = (curl_llist_element *)0x0;
  return (curl_hash_element *)0x0;
}

Assistant:

struct curl_hash_element *
Curl_hash_next_element(struct curl_hash_iterator *iter)
{
  int i;
  struct curl_hash *h = iter->hash;

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    for(i = iter->slot_index;i < h->slots;i++) {
      if(h->table[i]->head) {
        iter->current_element = h->table[i]->head;
        iter->slot_index = i+1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  else {
    iter->current_element = NULL;
    return NULL;
  }
}